

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetFilesPathsRecursively.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetFilePathsRecursively
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  char *pcVar2;
  string local_90;
  string local_70 [48];
  string local_40 [8];
  string nonTrailingSlashPath;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  nonTrailingSlashPath.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_40,(string *)path);
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)path);
    if (*pcVar2 == '/') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_70,(ulong)path);
      std::__cxx11::string::operator=(local_40,local_70);
      std::__cxx11::string::~string(local_70);
    }
    std::__cxx11::string::string((string *)&local_90,local_40);
    _getFilePathsRecursively(&local_90,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    nonTrailingSlashPath.field_2._M_local_buf[0xf] = '\x01';
    nonTrailingSlashPath.field_2._8_4_ = 1;
    std::__cxx11::string::~string(local_40);
  }
  else {
    nonTrailingSlashPath.field_2._M_local_buf[0xf] = '\x01';
    nonTrailingSlashPath.field_2._8_4_ = 1;
  }
  if ((nonTrailingSlashPath.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetFilePathsRecursively(const std::string path) {
    std::vector<std::string> result;

    if (path.empty()){
        return result;
    }

    std::string nonTrailingSlashPath = path;
    if (path[path.size()-1] == '/') {
        nonTrailingSlashPath = path.substr(0, path.size() - 1);
    }

    _getFilePathsRecursively(nonTrailingSlashPath, result);

    return result;
}